

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

int Abc_NodeMakeLegit(Abc_Obj_t *pNode)

{
  undefined4 local_18;
  undefined4 local_14;
  int fChanges;
  int i;
  Abc_Obj_t *pNode_local;
  
  local_18 = 1;
  local_14 = 0;
  while (local_18 != 0) {
    Abc_NodeMakeDist1Free(pNode);
    local_18 = Abc_NodeMakeSCCFree(pNode);
    local_14 = local_14 + 1;
  }
  return (int)(1 < local_14);
}

Assistant:

int Abc_NodeMakeLegit( Abc_Obj_t * pNode )
{
    int i, fChanges = 1;
    for ( i = 0; fChanges; i++ )
    {
        Abc_NodeMakeDist1Free( pNode );
        fChanges = Abc_NodeMakeSCCFree( pNode );
    }
//    Abc_NodeCheckDist1Free( pNode );
    return i > 1;
}